

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

string * Catch::Matchers::Generic::Detail::finalizeDescription
                   (string *__return_storage_ptr__,string *desc)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *desc_local;
  
  local_18 = desc;
  desc_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(&local_50,"matches predicate: \"",local_18);
    std::operator+(__return_storage_ptr__,&local_50,'\"');
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"matches undescribed predicate",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Catch::Matchers::Generic::Detail::finalizeDescription(const std::string& desc) {
    if (desc.empty()) {
        return "matches undescribed predicate";
    } else {
        return "matches predicate: \"" + desc + '"';
    }
}